

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

int __thiscall duckdb_re2::Regexp::Walker<int>::Walk(Walker<int> *this,Regexp *re,int top_arg)

{
  int iVar1;
  
  this->max_visits_ = 1000000;
  iVar1 = WalkInternal(this,re,top_arg,true);
  return iVar1;
}

Assistant:

T Regexp::Walker<T>::Walk(Regexp* re, T top_arg) {
  // Without the exponential walking behavior,
  // this budget should be more than enough for any
  // regexp, and yet not enough to get us in trouble
  // as far as CPU time.
  max_visits_ = 1000000;
  return WalkInternal(re, top_arg, true);
}